

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void rotate_x_flags(TCGContext_conflict2 *tcg_ctx,TCGv_i32 reg,TCGv_i32 X,int size)

{
  if (size == 0x10) {
    tcg_gen_ext16s_i32_m68k(tcg_ctx,reg,reg);
  }
  else if (size == 8) {
    tcg_gen_ext8s_i32_m68k(tcg_ctx,reg,reg);
  }
  tcg_gen_mov_i32(tcg_ctx,QREG_CC_N,reg);
  tcg_gen_mov_i32(tcg_ctx,QREG_CC_Z,reg);
  tcg_gen_mov_i32(tcg_ctx,QREG_CC_X,X);
  tcg_gen_mov_i32(tcg_ctx,QREG_CC_C,X);
  tcg_gen_movi_i32(tcg_ctx,QREG_CC_V,0);
  return;
}

Assistant:

static void rotate_x_flags(TCGContext *tcg_ctx, TCGv reg, TCGv X, int size)
{
    switch (size) {
    case 8:
        tcg_gen_ext8s_i32(tcg_ctx, reg, reg);
        break;
    case 16:
        tcg_gen_ext16s_i32(tcg_ctx, reg, reg);
        break;
    default:
        break;
    }
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_N, reg);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, reg);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_X, X);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, X);
    tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
}